

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

Slice __thiscall leveldb::anon_unknown_7::TwoLevelIterator::key(TwoLevelIterator *this)

{
  long lVar1;
  ulong uVar2;
  IteratorWrapper *in_RDI;
  long in_FS_OFFSET;
  Slice SVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (*(code *)(in_RDI->iter_->cleanup_head_).arg1)();
  if ((uVar2 & 1) == 0) {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/two_level_iterator.cc"
                  ,0x21,
                  "virtual Slice leveldb::(anonymous namespace)::TwoLevelIterator::key() const");
  }
  SVar3 = IteratorWrapper::key(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SVar3;
  }
  __stack_chk_fail();
}

Assistant:

Slice key() const override {
    assert(Valid());
    return data_iter_.key();
  }